

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
::Grow(HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
       *this)

{
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar1;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar2;
  size_t sVar3;
  optional<std::pair<pbrt::LightHandle,_unsigned_long>_> *poVar4;
  undefined8 uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  newTable;
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  local_50;
  polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_> local_30;
  
  sVar3 = (this->table).nStored;
  sVar7 = 0x40;
  if (0x40 < sVar3 * 2) {
    sVar7 = sVar3 * 2;
  }
  local_30.memoryResource = (this->table).alloc.memoryResource;
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::vector(&local_50,sVar7,&local_30);
  if (sVar3 != 0) {
    poVar4 = (this->table).ptr;
    sVar7 = 0;
    do {
      if (poVar4[sVar7].set == true) {
        poVar1 = poVar4 + sVar7;
        uVar8 = ((ulong)(poVar1->optionalValue).__align & 0xffffffffffff) * -0x395b586ca42e166b;
        uVar8 = ((uVar8 >> 0x2f ^ uVar8) * -0x395b586ca42e166b ^ 0x35253c9ade8f4ca8) *
                -0x395b586ca42e166b;
        uVar9 = (uVar8 >> 0x2f ^ uVar8) * -0x395b586ca42e166b;
        uVar8 = 0;
        do {
          iVar6 = (int)uVar8;
          uVar10 = (ulong)((uint)(iVar6 * iVar6) >> 1) +
                   (uVar8 >> 1) + ((uVar9 >> 0x2f ^ uVar9) & local_50.nStored - 1) &
                   local_50.nStored - 1;
          uVar8 = (ulong)(iVar6 + 1);
        } while (local_50.ptr[uVar10].set != false);
        if (poVar1->set == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
        }
        poVar2 = local_50.ptr + uVar10;
        (poVar2->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
        uVar5 = *(undefined8 *)((long)&poVar1->optionalValue + 8);
        (poVar2->optionalValue).__align = (poVar1->optionalValue).__align;
        *(undefined8 *)((long)&poVar2->optionalValue + 8) = uVar5;
        poVar2->set = true;
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != sVar3);
  }
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::operator=(&this->table,&local_50);
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::~vector(&local_50);
  return;
}

Assistant:

void Grow() {
        size_t currentCapacity = capacity();
        pstd::vector<TableEntry> newTable(std::max<size_t>(64, 2 * currentCapacity),
                                          table.get_allocator());
        size_t newCapacity = newTable.size();
        for (size_t i = 0; i < currentCapacity; ++i) {
            // Insert _table[i]_ into _newTable_ if it is set
            if (!table[i].has_value())
                continue;
            size_t baseOffset = Hash()(table[i]->first) & (newCapacity - 1);
            for (int nProbes = 0;; ++nProbes) {
                size_t offset = (baseOffset + nProbes / 2 + nProbes * nProbes / 2) &
                                (newCapacity - 1);
                if (!newTable[offset]) {
                    newTable[offset] = std::move(*table[i]);
                    break;
                }
            }
        }
        table = std::move(newTable);
    }